

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O2

void __thiscall
pbrt::FormattingScene::MediumInterface
          (FormattingScene *this,string *insideName,string *outsideName,FileLoc loc)

{
  string sStack_38;
  
  indent_abi_cxx11_(&sStack_38,this,0);
  Printf<std::__cxx11::string,std::__cxx11::string_const&,std::__cxx11::string_const&>
            ("%sMediumInterface \"%s\" \"%s\"\n",&sStack_38,insideName,outsideName);
  std::__cxx11::string::~string((string *)&sStack_38);
  return;
}

Assistant:

void FormattingScene::MediumInterface(const std::string &insideName,
                                      const std::string &outsideName, FileLoc loc) {
    Printf("%sMediumInterface \"%s\" \"%s\"\n", indent(), insideName, outsideName);
}